

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosenbrock.cpp
# Opt level: O2

double rosenbrock(VectorXd *x)

{
  ostream *poVar1;
  long lVar2;
  Scalar *pSVar3;
  long row;
  double dVar4;
  double dVar5;
  
  lVar2 = *(long *)(x + 8);
  if (lVar2 < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"dimension must be greater one");
    std::endl<char,std::char_traits<char>>(poVar1);
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    row = 0;
    while (row < lVar2 + -1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,row,0);
      dVar5 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,row + 1,0)
      ;
      dVar5 = dVar5 * dVar5 - *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,row,0);
      dVar4 = dVar4 + dVar5 * dVar5 * 100.0 + (*pSVar3 + -1.0) * (*pSVar3 + -1.0);
      row = row + 1;
      lVar2 = *(long *)(x + 8);
    }
  }
  return dVar4;
}

Assistant:

double rosenbrock(Eigen::VectorXd x)
{
	if (x.size() < 2)
	{
		std::cout << "dimension must be greater one" << std::endl;
		return 0;
	}
	else
	{
		double f = 0;
		for (int i = 0; i < x.size() - 1; i++)
			f += 100 * (pow((pow((x(i, 0)), 2) - x(i + 1, 0)), 2)) + pow((x(i, 0) - 1), 2);
		return f;
	}
}